

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::drawFlow
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          Iterator it,QList<QTextFrame_*> *floats,QTextBlock *cursorBlockNeedingRepaint)

{
  double dVar1;
  QAbstractTextDocumentLayout *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint objectType;
  QTextFrame *pQVar6;
  QTextObjectInterface *pQVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  QTextDocumentLayoutPrivate *this_01;
  PaintContext *pPVar13;
  QCheckPoint *pQVar14;
  QCheckPoint *pQVar15;
  QTextFrame *c;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  PaintContext pc;
  QTextFrame *local_e8;
  undefined1 local_b8 [16];
  QTextFormat local_a8;
  PaintContext local_98;
  QTextBlock local_48;
  long local_38;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractTextDocumentLayout **)
             &(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8;
  if (((it.cf == (QTextFrame *)0x0) && (it.cb == it.e)) || (it.f == (QTextFrame *)0x0)) {
    bVar16 = false;
  }
  else {
    pQVar6 = QTextFrame::parentFrame(it.f);
    bVar16 = pQVar6 == (QTextFrame *)0x0;
  }
  pQVar14 = (this->checkPoints).d.ptr;
  uVar11 = (this->checkPoints).d.size;
  pQVar15 = pQVar14 + uVar11;
  if (((bVar16) && (0.0 < (context->clip).w)) &&
     ((dVar1 = (context->clip).h, 0.0 < dVar1 && (pQVar15 = pQVar14, 0 < (long)uVar11)))) {
    do {
      uVar9 = uVar11 >> 1;
      uVar10 = uVar9;
      if (pQVar14[uVar9].y.val < (int)((dVar1 + (context->clip).yp) * 64.0)) {
        uVar10 = ~uVar9 + uVar11;
        pQVar14 = pQVar14 + uVar9 + 1;
      }
      uVar11 = uVar10;
      pQVar15 = pQVar14;
    } while (0 < (long)uVar10);
  }
  local_48.p = (QTextDocumentPrivate *)0x0;
  local_48.n = 0;
  local_48._12_4_ = 0xaaaaaaaa;
  bVar17 = it.cf == (QTextFrame *)0x0;
  if ((!bVar17) || (it.cb != it.e)) {
    local_e8 = (QTextFrame *)0x0;
    do {
      pQVar6 = it.cf;
      if ((bVar16 == false) || ((this->checkPoints).d.size == 0)) {
LAB_004eed1b:
        if (bVar17) {
          puVar12 = &DAT_006bc760;
          pPVar13 = &local_98;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *(undefined8 *)pPVar13 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
            pPVar13 = (PaintContext *)((long)pPVar13 + ((ulong)bVar18 * -2 + 1) * 8);
          }
          local_98.cursorPosition = context->cursorPosition;
          QPalette::QPalette(&local_98.palette,&context->palette);
          local_98.clip.xp = (context->clip).xp;
          local_98.clip.yp = (context->clip).yp;
          local_98.clip.w = (context->clip).w;
          local_98.clip.h = (context->clip).h;
          local_98.selections.d.d = (context->selections).d.d;
          local_98.selections.d.ptr = (context->selections).d.ptr;
          local_98.selections.d.size = (context->selections).d.size;
          if (local_98.selections.d.d != (Data *)0x0) {
            LOCK();
            ((local_98.selections.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_98.selections.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QTextFrame::iterator::currentBlock(&it);
          lVar8 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (((lVar8 != 0) && (bVar17 = QTextBlock::isValid((QTextBlock *)&local_a8), bVar17)) &&
             (iVar4 = QTextBlock::length((QTextBlock *)&local_a8), iVar4 == 1)) {
            iVar4 = QTextFrame::lastPosition(local_e8);
            iVar5 = QTextBlock::position((QTextBlock *)&local_a8);
            if (iVar4 == iVar5 + -1) {
              QList<QAbstractTextDocumentLayout::Selection>::clear(&local_98.selections);
            }
          }
          QTextFrame::iterator::currentBlock(&it);
          drawBlock(this,offset,painter,&local_98,(QTextBlock *)&local_a8,bVar16);
          QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
                    (&local_98.selections.d);
          QPalette::~QPalette(&local_98.palette);
        }
        else {
          drawFrame(this,offset,painter,context,pQVar6);
        }
        QTextBlock::blockFormat((QTextBlock *)&local_98);
        if (((it.cf == (QTextFrame *)0x0) && (it.cb == it.e)) ||
           (((lVar8 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject), lVar8 == 0 ||
             (((bVar17 = QTextBlock::isValid(&local_48), !bVar17 ||
               (iVar4 = QTextBlock::length(&local_48), iVar4 != 1)) ||
              (bVar17 = QTextFormat::hasProperty((QTextFormat *)&local_98,0x1060), bVar17)))) ||
            (bVar17 = QTextFormat::hasProperty((QTextFormat *)&local_98,0x820), bVar17)))) {
LAB_004eef6f:
          QTextFormat::~QTextFormat((QTextFormat *)&local_98);
        }
        else {
          iVar4 = QTextFrame::firstPosition(it.cf);
          iVar5 = QTextBlock::position(&local_48);
          if (iVar4 != iVar5 + 1) goto LAB_004eef6f;
          bVar17 = QTextBlock::contains(&local_48,context->cursorPosition);
          QTextFormat::~QTextFormat((QTextFormat *)&local_98);
          if (bVar17) {
            cursorBlockNeedingRepaint->p = local_48.p;
            cursorBlockNeedingRepaint->n = local_48.n;
          }
        }
        QTextFrame::iterator::currentBlock(&it);
        local_48.p = (QTextDocumentPrivate *)CONCAT44(local_98._4_4_,local_98.cursorPosition);
        local_48.n = (int)local_98.palette.d;
        bVar3 = false;
        local_e8 = pQVar6;
      }
      else {
        if (bVar17) {
          QTextFrame::iterator::currentBlock(&it);
          iVar4 = QTextBlock::position((QTextBlock *)&local_98);
        }
        else {
          iVar4 = QTextFrame::firstPosition(it.cf);
        }
        pQVar14 = (this->checkPoints).d.ptr;
        lVar8 = (this->checkPoints).d.size;
        bVar3 = true;
        if ((pQVar14[lVar8 + -1].positionInFrame <= iVar4) ||
           ((((pQVar15 != pQVar14 + lVar8 && (0.0 < (context->clip).w)) && (0.0 < (context->clip).h)
             ) && (pQVar15->positionInFrame <= iVar4)))) {
          bVar2 = false;
        }
        else {
          bVar3 = false;
          bVar2 = true;
        }
        if (bVar2) goto LAB_004eed1b;
      }
      if (bVar3) break;
      QTextFrame::iterator::operator++(&it);
      bVar17 = it.cf == (QTextFrame *)0x0;
    } while ((!bVar17) || (it.cb != it.e));
  }
  if ((floats->d).size != 0) {
    uVar11 = 0;
    do {
      pQVar6 = (floats->d).ptr[uVar11];
      iVar4 = QTextFrame::firstPosition(pQVar6);
      iVar5 = QTextFrame::lastPosition(pQVar6);
      bVar16 = true;
      if (iVar5 < iVar4) {
        QTextFrame::frameFormat((QTextFrame *)&local_a8);
        iVar4 = QTextFormat::intProperty(&local_a8,0x800);
        bVar16 = iVar4 == 0;
        QTextFormat::~QTextFormat(&local_a8);
      }
      if (!bVar16) {
        iVar4 = QTextFrame::firstPosition(pQVar6);
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QAbstractTextDocumentLayout::format((QAbstractTextDocumentLayout *)local_b8,(int)this_00);
        objectType = QTextFormat::intProperty((QTextFormat *)local_b8,0x2f00);
        this_01 = (QTextDocumentLayoutPrivate *)(ulong)objectType;
        pQVar7 = QAbstractTextDocumentLayout::handlerForObject(this_00,objectType);
        if (pQVar7 != (QTextObjectInterface *)0x0) {
          local_98.palette.currentGroup = ~Active;
          local_98.palette._12_4_ = 0xffffffff;
          local_98.clip.xp = -NAN;
          local_98.cursorPosition = -1;
          local_98._4_4_ = 0xffffffff;
          local_98.palette.d._0_4_ = -1;
          local_98.palette.d._4_4_ = 0xffffffff;
          frameBoundingRectInternal((QRectF *)&local_98,this_01,pQVar6);
          (*pQVar7->_vptr_QTextObjectInterface[3])
                    (pQVar7,painter,&local_98,
                     (this->super_QAbstractTextDocumentLayoutPrivate).document,(ulong)(iVar4 - 1),
                     local_b8);
        }
        QTextFormat::~QTextFormat((QTextFormat *)local_b8);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(floats->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawFlow(const QPointF &offset, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &context,
                                          QTextFrame::Iterator it, const QList<QTextFrame *> &floats, QTextBlock *cursorBlockNeedingRepaint) const
{
    Q_Q(const QTextDocumentLayout);
    const bool inRootFrame = (!it.atEnd() && it.parentFrame() && it.parentFrame()->parentFrame() == nullptr);

    auto lastVisibleCheckPoint = checkPoints.end();
    if (inRootFrame && context.clip.isValid()) {
        lastVisibleCheckPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), QFixed::fromReal(context.clip.bottom()));
    }

    QTextBlock previousBlock;
    QTextFrame *previousFrame = nullptr;

    for (; !it.atEnd(); ++it) {
        QTextFrame *c = it.currentFrame();

        if (inRootFrame && !checkPoints.isEmpty()) {
            int currentPosInDoc;
            if (c)
                currentPosInDoc = c->firstPosition();
            else
                currentPosInDoc = it.currentBlock().position();

            // if we're past what is already laid out then we're better off
            // not trying to draw things that may not be positioned correctly yet
            if (currentPosInDoc >= checkPoints.constLast().positionInFrame)
                break;

            if (lastVisibleCheckPoint != checkPoints.end()
                && context.clip.isValid()
                && currentPosInDoc >= lastVisibleCheckPoint->positionInFrame
               )
                break;
        }

        if (c)
            drawFrame(offset, painter, context, c);
        else {
            QAbstractTextDocumentLayout::PaintContext pc = context;
            if (isEmptyBlockAfterTable(it.currentBlock(), previousFrame))
                pc.selections.clear();
            drawBlock(offset, painter, pc, it.currentBlock(), inRootFrame);
        }

        // when entering a table and the previous block is empty
        // then layoutFlow 'hides' the block that just causes a
        // new line by positioning it /on/ the table border. as we
        // draw that block before the table itself the decoration
        // 'overpaints' the cursor and we need to paint it afterwards
        // again
        if (isEmptyBlockBeforeTable(previousBlock, previousBlock.blockFormat(), it)
            && previousBlock.contains(context.cursorPosition)
           ) {
            *cursorBlockNeedingRepaint = previousBlock;
        }

        previousBlock = it.currentBlock();
        previousFrame = c;
    }

    for (int i = 0; i < floats.size(); ++i) {
        QTextFrame *frame = floats.at(i);
        if (!isFrameFromInlineObject(frame)
            || frame->frameFormat().position() == QTextFrameFormat::InFlow)
            continue;

        const int pos = frame->firstPosition() - 1;
        QTextCharFormat format = const_cast<QTextDocumentLayout *>(q)->format(pos);
        QTextObjectInterface *handler = q->handlerForObject(format.objectType());
        if (handler) {
            QRectF rect = frameBoundingRectInternal(frame);
            handler->drawObject(painter, rect, document, pos, format);
        }
    }
}